

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O2

TRIPLERGB **
decimationAndRecovering
          (TRIPLERGB **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,int decimation,int k,
          char *filenameDecimate,char *filenameRecover)

{
  BITMAPINFOHEADER bmInfo_00;
  TRIPLERGB **ppTVar1;
  BITMAPFILEHEADER local_60;
  BITMAPINFOHEADER local_50;
  
  if (decimation == 1) {
    decimationMean(bmFile,bmInfo,mrx,k,filenameDecimate);
  }
  else if (decimation == 0) {
    decimationEjection(bmFile,bmInfo,mrx,k,filenameDecimate);
  }
  ppTVar1 = loadBMPFile(&local_60,&local_50,filenameDecimate);
  bmInfo_00.biHeight = local_50.biHeight;
  bmInfo_00.biPlanes = local_50.biPlanes;
  bmInfo_00.biBitCount = local_50.biBitCount;
  bmInfo_00.biSize = local_50.biSize;
  bmInfo_00.biWidth = local_50.biWidth;
  bmInfo_00.biCompression = local_50.biCompression;
  bmInfo_00.biSizeImage = local_50.biSizeImage;
  bmInfo_00.biXPelsPerMeter = local_50.biXPelsPerMeter;
  bmInfo_00.biYPelsPerMeter = local_50.biYPelsPerMeter;
  bmInfo_00.biClrUsed = local_50.biClrUsed;
  bmInfo_00.biClrImportant = local_50.biClrImportant;
  ppTVar1 = recovery(local_60,bmInfo_00,ppTVar1,k,filenameRecover);
  return ppTVar1;
}

Assistant:

TRIPLERGB **decimationAndRecovering(TRIPLERGB **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo,
                                    int decimation, int k, const char *filenameDecimate, const char *filenameRecover) {
    switch (decimation) {
        case DECIMATION_EJECT:
            decimationEjection(bmFile, bmInfo, mrx, k, filenameDecimate);
            break;
        case DECIMATION_MEAN:
            decimationMean(bmFile, bmInfo, mrx, k, filenameDecimate);
            break;
        default:
            break;
    }

    BITMAPFILEHEADER bmFileDecimat;
    BITMAPINFOHEADER bmInfoDecimat;
    TRIPLERGB **mrxDecimat = loadBMPFile(&bmFileDecimat, &bmInfoDecimat, filenameDecimate);
    TRIPLERGB **mrxRecov = recovery(bmFileDecimat, bmInfoDecimat, mrxDecimat, k, filenameRecover);

    //cout << "-------------------------------------\n";
    return mrxRecov;
}